

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::setGhosted(Application *this,bool isGhosted)

{
  bool bVar1;
  reference ppSVar2;
  byte in_SIL;
  long in_RDI;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range1;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffffc8;
  SceneObject *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  *(byte *)(in_RDI + 0x45a) = local_9;
  local_18 = *(long *)(in_RDI + 0x48) + 0x98;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = *ppSVar2;
    in_stack_ffffffffffffffd0->isGhosted = (bool)(local_9 & 1);
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void Application::setGhosted(bool isGhosted) {
  this->isGhosted = isGhosted;
  for (auto object : scene->objects) {
    object->isGhosted = isGhosted;
  }
}